

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_4::Repairer::ArchiveFile(Repairer *this,string *fname)

{
  char *__s;
  Logger *info_log;
  pointer pcVar1;
  char *pcVar2;
  Status s;
  string new_dir;
  string new_file;
  Status local_98;
  void *local_90;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  __s = (fname->_M_dataplus)._M_p;
  pcVar2 = strrchr(__s,0x2f);
  local_80 = 0;
  local_78[0] = 0;
  local_88 = local_78;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_88,0,(char *)0x0,(ulong)__s);
  }
  std::__cxx11::string::append((char *)&local_88);
  (*this->env_->_vptr_Env[9])(&local_90,this->env_,&local_88);
  if (local_90 != (void *)0x0) {
    operator_delete__(local_90);
  }
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)local_68,local_88,local_88 + local_80);
  std::__cxx11::string::append((char *)local_68);
  std::__cxx11::string::append((char *)local_68);
  (*this->env_->_vptr_Env[0xc])(&local_98,this->env_,fname,local_68);
  info_log = (this->options_).info_log;
  pcVar1 = (fname->_M_dataplus)._M_p;
  Status::ToString_abi_cxx11_(&local_48,&local_98);
  Log(info_log,"Archiving %s: %s\n",pcVar1,local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_98.state_ != (char *)0x0) {
    operator_delete__(local_98.state_);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return;
}

Assistant:

void ArchiveFile(const std::string& fname) {
    // Move into another directory.  E.g., for
    //    dir/foo
    // rename to
    //    dir/lost/foo
    const char* slash = strrchr(fname.c_str(), '/');
    std::string new_dir;
    if (slash != nullptr) {
      new_dir.assign(fname.data(), slash - fname.data());
    }
    new_dir.append("/lost");
    env_->CreateDir(new_dir);  // Ignore error
    std::string new_file = new_dir;
    new_file.append("/");
    new_file.append((slash == nullptr) ? fname.c_str() : slash + 1);
    Status s = env_->RenameFile(fname, new_file);
    Log(options_.info_log, "Archiving %s: %s\n", fname.c_str(),
        s.ToString().c_str());
  }